

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_growable_writer_teardown(mpack_writer_t *writer)

{
  mpack_error_t mVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  size_t local_40;
  char *buffer;
  size_t size;
  size_t used;
  mpack_growable_writer_t *growable_writer;
  mpack_writer_t *writer_local;
  
  pcVar2 = mpack_writer_get_reserved(writer);
  mVar1 = mpack_writer_error(writer);
  if (mVar1 == mpack_ok) {
    sVar3 = mpack_writer_buffer_used(writer);
    sVar4 = mpack_writer_buffer_size(writer);
    if (sVar3 < sVar4 >> 1) {
      sVar3 = mpack_writer_buffer_used(writer);
      local_40 = sVar3;
      if (sVar3 == 0) {
        local_40 = 1;
      }
      pcVar5 = (char *)mpack_realloc(writer->buffer,sVar3,local_40);
      if (pcVar5 == (char *)0x0) {
        free(writer->buffer);
        mpack_writer_flag_error(writer,mpack_error_memory);
        return;
      }
      writer->buffer = pcVar5;
      writer->current = writer->buffer + sVar3;
      writer->end = writer->buffer + sVar3;
    }
    **(undefined8 **)pcVar2 = writer->buffer;
    sVar3 = mpack_writer_buffer_used(writer);
    **(size_t **)(pcVar2 + 8) = sVar3;
    writer->buffer = (char *)0x0;
  }
  else if (writer->buffer != (char *)0x0) {
    free(writer->buffer);
    writer->buffer = (char *)0x0;
  }
  writer->context = (void *)0x0;
  return;
}

Assistant:

static void mpack_growable_writer_teardown(mpack_writer_t* writer) {
    mpack_growable_writer_t* growable_writer = (mpack_growable_writer_t*)mpack_writer_get_reserved(writer);

    if (mpack_writer_error(writer) == mpack_ok) {

        // shrink the buffer to an appropriate size if the data is
        // much smaller than the buffer
        if (mpack_writer_buffer_used(writer) < mpack_writer_buffer_size(writer) / 2) {
            size_t used = mpack_writer_buffer_used(writer);

            // We always return a non-null pointer that must be freed, even if
            // nothing was written. malloc() and realloc() do not necessarily
            // do this so we enforce it ourselves.
            size_t size = (used != 0) ? used : 1;

            char* buffer = (char*)mpack_realloc(writer->buffer, used, size);
            if (!buffer) {
                MPACK_FREE(writer->buffer);
                mpack_writer_flag_error(writer, mpack_error_memory);
                return;
            }
            writer->buffer = buffer;
            writer->end = (writer->current = writer->buffer + used);
        }

        *growable_writer->target_data = writer->buffer;
        *growable_writer->target_size = mpack_writer_buffer_used(writer);
        writer->buffer = NULL;

    } else if (writer->buffer) {
        MPACK_FREE(writer->buffer);
        writer->buffer = NULL;
    }

    writer->context = NULL;
}